

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void av1_setup_build_prediction_by_left_pred
               (MACROBLOCKD *xd,int rel_mi_row,uint8_t left_mi_height,MB_MODE_INFO *left_mbmi,
               build_prediction_ctxt *ctxt,int num_planes)

{
  BLOCK_SIZE BVar1;
  int idx;
  int iVar2;
  int iVar3;
  scale_factors *sf;
  MB_MODE_INFO *in_RCX;
  byte in_DL;
  int in_ESI;
  int *in_RDI;
  long in_R8;
  int in_R9D;
  scale_factors *ref_scale_factors;
  RefCntBuffer *ref_buf;
  MV_REFERENCE_FRAME frame;
  int ref;
  int num_refs;
  macroblockd_plane *pd;
  int j;
  int left_mi_row;
  BLOCK_SIZE l_bsize;
  MV_REFERENCE_FRAME in_stack_ffffffffffffff6f;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff84;
  BLOCK_SIZE in_stack_ffffffffffffff8f;
  buf_2d *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  MV_REFERENCE_FRAME MVar4;
  int in_stack_ffffffffffffffb8;
  int mi_col;
  YV12_BUFFER_CONFIG *in_stack_ffffffffffffffc0;
  int local_38;
  undefined3 in_stack_ffffffffffffffd0;
  undefined4 uVar5;
  
  if (in_RCX->bsize < BLOCK_8X8) {
    BVar1 = BLOCK_8X8;
  }
  else {
    BVar1 = in_RCX->bsize;
  }
  uVar5 = CONCAT13(BVar1,in_stack_ffffffffffffffd0);
  idx = *in_RDI + in_ESI;
  modify_neighbor_predictor_for_obmc(in_RCX);
  for (local_38 = 0; local_38 < in_R9D; local_38 = local_38 + 1) {
    in_stack_ffffffffffffffc0 = (YV12_BUFFER_CONFIG *)(in_RDI + (long)local_38 * 0x28c + 4);
    in_stack_ffffffffffffff70 = 0;
    setup_pred_plane(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f,
                     (uint8_t *)
                     CONCAT44(in_stack_ffffffffffffff84,
                              (in_stack_ffffffffffffffc0->field_0).field_0.uv_width),0,0,
                     in_stack_ffffffffffffff74,(int)in_stack_ffffffffffffffa0,
                     (int)in_stack_ffffffffffffffa8,
                     (scale_factors *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffb8,(int)in_stack_ffffffffffffffc0);
  }
  iVar2 = has_second_ref(in_RCX);
  iVar2 = iVar2 + 1;
  for (mi_col = 0; mi_col < iVar2; mi_col = mi_col + 1) {
    MVar4 = in_RCX->ref_frame[mi_col];
    get_ref_frame_buf((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff6f);
    sf = get_ref_scale_factors_const
                   ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                    in_stack_ffffffffffffff6f);
    *(scale_factors **)(in_RDI + (long)mi_col * 2 + 0x7c2) = sf;
    iVar3 = av1_is_valid_scale(sf);
    if (iVar3 == 0) {
      aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0xa7c),AOM_CODEC_UNSUP_BITSTREAM,
                         "Reference frame has invalid dimensions");
    }
    av1_setup_pre_planes
              ((MACROBLOCKD *)CONCAT44(in_R9D,uVar5),idx,in_stack_ffffffffffffffc0,iVar2,mi_col,
               (scale_factors *)CONCAT17(MVar4,in_stack_ffffffffffffffb0),(int)in_RDI);
  }
  in_RDI[0x7bf] = idx * -0x20;
  in_RDI[0x7c0] =
       *(int *)(in_R8 + 0x28) +
       (((uint)*(byte *)((long)in_RDI + 0x2075) - in_ESI) - (uint)in_DL) * 0x20;
  return;
}

Assistant:

void av1_setup_build_prediction_by_left_pred(MACROBLOCKD *xd, int rel_mi_row,
                                             uint8_t left_mi_height,
                                             MB_MODE_INFO *left_mbmi,
                                             struct build_prediction_ctxt *ctxt,
                                             const int num_planes) {
  const BLOCK_SIZE l_bsize = AOMMAX(BLOCK_8X8, left_mbmi->bsize);
  const int left_mi_row = xd->mi_row + rel_mi_row;

  modify_neighbor_predictor_for_obmc(left_mbmi);

  for (int j = 0; j < num_planes; ++j) {
    struct macroblockd_plane *const pd = &xd->plane[j];
    setup_pred_plane(&pd->dst, l_bsize, ctxt->tmp_buf[j], ctxt->tmp_width[j],
                     ctxt->tmp_height[j], ctxt->tmp_stride[j], rel_mi_row, 0,
                     NULL, pd->subsampling_x, pd->subsampling_y);
  }

  const int num_refs = 1 + has_second_ref(left_mbmi);

  for (int ref = 0; ref < num_refs; ++ref) {
    const MV_REFERENCE_FRAME frame = left_mbmi->ref_frame[ref];

    const RefCntBuffer *const ref_buf = get_ref_frame_buf(ctxt->cm, frame);
    const struct scale_factors *const ref_scale_factors =
        get_ref_scale_factors_const(ctxt->cm, frame);

    xd->block_ref_scale_factors[ref] = ref_scale_factors;
    if ((!av1_is_valid_scale(ref_scale_factors)))
      aom_internal_error(xd->error_info, AOM_CODEC_UNSUP_BITSTREAM,
                         "Reference frame has invalid dimensions");
    av1_setup_pre_planes(xd, ref, &ref_buf->buf, left_mi_row, xd->mi_col,
                         ref_scale_factors, num_planes);
  }

  xd->mb_to_top_edge = GET_MV_SUBPEL(MI_SIZE * (-left_mi_row));
  xd->mb_to_bottom_edge =
      ctxt->mb_to_far_edge +
      GET_MV_SUBPEL((xd->height - rel_mi_row - left_mi_height) * MI_SIZE);
}